

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_string_utils.c
# Opt level: O0

int coda__pcre2_strncmp_c8_8(PCRE2_SPTR8 str1,char *str2,size_t len)

{
  PCRE2_UCHAR8 c2;
  size_t sStack_28;
  PCRE2_UCHAR8 c1;
  size_t len_local;
  char *str2_local;
  PCRE2_SPTR8 str1_local;
  
  sStack_28 = len;
  len_local = (size_t)str2;
  str2_local = (char *)str1;
  while( true ) {
    if (sStack_28 == 0) {
      return 0;
    }
    if (*str2_local != *(byte *)len_local) break;
    sStack_28 = sStack_28 - 1;
    len_local = len_local + 1;
    str2_local = str2_local + 1;
  }
  return (uint)(*(byte *)len_local < (byte)*str2_local) * 2 + -1;
}

Assistant:

int
PRIV(strncmp_c8)(PCRE2_SPTR str1, const char *str2, size_t len)
{
PCRE2_UCHAR c1, c2;
for (; len > 0; len--)
  {
  c1 = *str1++;
  c2 = *str2++;
  if (c1 != c2) return ((c1 > c2) << 1) - 1;
  }
return 0;
}